

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void ptrmapPutOvflPtr(MemPage *pPage,u8 *pCell,int *pRC)

{
  u32 key;
  CellInfo info;
  
  if (*pRC != 0) {
    return;
  }
  (*pPage->xParseCell)(pPage,pCell,&info);
  if (info.nLocal < info.nPayload) {
    key = sqlite3Get4byte(pCell + ((ulong)info.nSize - 4));
    ptrmapPut(pPage->pBt,key,'\x03',pPage->pgno,pRC);
  }
  return;
}

Assistant:

static void ptrmapPutOvflPtr(MemPage *pPage, u8 *pCell, int *pRC){
  CellInfo info;
  if( *pRC ) return;
  assert( pCell!=0 );
  pPage->xParseCell(pPage, pCell, &info);
  if( info.nLocal<info.nPayload ){
    Pgno ovfl = get4byte(&pCell[info.nSize-4]);
    ptrmapPut(pPage->pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, pRC);
  }
}